

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AddDefaultValue(Parse *pParse,ExprSpan *pSpan)

{
  short sVar1;
  sqlite3 *db;
  Table *pTVar2;
  Column *pCVar3;
  char *__src;
  int iVar4;
  Expr *pEVar5;
  char *__dest;
  Walker local_58;
  
  db = pParse->db;
  pTVar2 = pParse->pNewTable;
  if (pTVar2 != (Table *)0x0) {
    sVar1 = pTVar2->nCol;
    pCVar3 = pTVar2->aCol;
    local_58.pParse = (Parse *)0x0;
    local_58.walkerDepth = 0;
    local_58.bSelectDepthFirst = '\0';
    local_58._29_3_ = 0;
    local_58.u = (anon_union_8_4_3af73d92_for_u)0x2;
    local_58.xExprCallback = exprNodeIsConstant;
    local_58.xSelectCallback = selectNodeIsConstant;
    sqlite3WalkExpr(&local_58,pSpan->pExpr);
    if (local_58.u.i == 0) {
      sqlite3ErrorMsg(pParse,"default value of column [%s] is not constant",
                      pCVar3[(long)sVar1 + -1].zName);
    }
    else {
      sqlite3ExprDelete(db,pCVar3[(long)sVar1 + -1].pDflt);
      __dest = (char *)0x0;
      pEVar5 = exprDup(db,pSpan->pExpr,1,(u8 **)0x0);
      pCVar3[(long)sVar1 + -1].pDflt = pEVar5;
      sqlite3DbFree(db,pCVar3[(long)sVar1 + -1].zDflt);
      __src = pSpan->zStart;
      if (__src != (char *)0x0) {
        iVar4 = (int)pSpan->zEnd - (int)__src;
        __dest = (char *)sqlite3DbMallocRaw(db,iVar4 + 1);
        if (__dest != (char *)0x0) {
          memcpy(__dest,__src,(long)iVar4);
          __dest[iVar4] = '\0';
        }
      }
      pCVar3[(long)sVar1 + -1].zDflt = __dest;
    }
  }
  sqlite3ExprDelete(db,pSpan->pExpr);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddDefaultValue(Parse *pParse, ExprSpan *pSpan){
  Table *p;
  Column *pCol;
  sqlite3 *db = pParse->db;
  p = pParse->pNewTable;
  if( p!=0 ){
    pCol = &(p->aCol[p->nCol-1]);
    if( !sqlite3ExprIsConstantOrFunction(pSpan->pExpr) ){
      sqlite3ErrorMsg(pParse, "default value of column [%s] is not constant",
          pCol->zName);
    }else{
      /* A copy of pExpr is used instead of the original, as pExpr contains
      ** tokens that point to volatile memory. The 'span' of the expression
      ** is required by pragma table_info.
      */
      sqlite3ExprDelete(db, pCol->pDflt);
      pCol->pDflt = sqlite3ExprDup(db, pSpan->pExpr, EXPRDUP_REDUCE);
      sqlite3DbFree(db, pCol->zDflt);
      pCol->zDflt = sqlite3DbStrNDup(db, (char*)pSpan->zStart,
                                     (int)(pSpan->zEnd - pSpan->zStart));
    }
  }
  sqlite3ExprDelete(db, pSpan->pExpr);
}